

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_decoder.c
# Opt level: O3

lzma_ret lzma_alone_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,uint64_t memlimit,_Bool picky)

{
  undefined8 *puVar1;
  
  if ((code *)next->init != lzma_alone_decoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_alone_decoder_init;
  puVar1 = (undefined8 *)next->coder;
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)lzma_alloc(0xe0,allocator);
    if (puVar1 == (undefined8 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = puVar1;
    next->code = alone_decode;
    next->end = alone_decoder_end;
    next->memconfig = alone_decoder_memconfig;
    *puVar1 = 0;
    puVar1[1] = 0xffffffffffffffff;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[8] = 0;
  }
  *(undefined4 *)(puVar1 + 9) = 0;
  *(_Bool *)((long)puVar1 + 0x4c) = picky;
  *(undefined4 *)(puVar1 + 0xe) = 0;
  puVar1[0xf] = 0;
  *(undefined4 *)(puVar1 + 0x10) = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = memlimit + (memlimit == 0);
  puVar1[0xd] = 0x8000;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_alone_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		uint64_t memlimit, bool picky)
{
	lzma_next_coder_init(&lzma_alone_decoder_init, next, allocator);

	lzma_alone_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_alone_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &alone_decode;
		next->end = &alone_decoder_end;
		next->memconfig = &alone_decoder_memconfig;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	coder->sequence = SEQ_PROPERTIES;
	coder->picky = picky;
	coder->pos = 0;
	coder->options.dict_size = 0;
	coder->options.preset_dict = NULL;
	coder->options.preset_dict_size = 0;
	coder->uncompressed_size = 0;
	coder->memlimit = my_max(1, memlimit);
	coder->memusage = LZMA_MEMUSAGE_BASE;

	return LZMA_OK;
}